

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Function *pFVar1;
  Module *pMVar2;
  ArgListType *this_00;
  Expression *pEVar3;
  pool_ref<soul::heart::Expression> local_68;
  pool_ref<soul::heart::Expression> *local_60;
  pool_ref<soul::heart::Expression> *arg;
  pool_ref<soul::heart::Expression> *__end2;
  pool_ref<soul::heart::Expression> *__begin2;
  ArgListType *__range2;
  pool_ptr<soul::heart::Expression> local_30;
  Module *local_20;
  FunctionCall *fc;
  FunctionCall *old_local;
  ModuleCloner *this_local;
  
  pMVar2 = this->newModule;
  local_30.object = *(Expression **)(__fn + 0x20);
  fc = (FunctionCall *)__fn;
  old_local = (FunctionCall *)this;
  cloneExpressionPtr((ModuleCloner *)&stack0xffffffffffffffd8,
                     (pool_ptr<soul::heart::Expression> *)this);
  pFVar1 = heart::FunctionCall::getFunction(fc);
  pFVar1 = getRemappedFunction(this,pFVar1);
  pMVar2 = (Module *)
           Module::
           allocate<soul::heart::FunctionCall,soul::CodeLocation_const&,soul::pool_ptr<soul::heart::Expression>,soul::heart::Function&>
                     (pMVar2,(CodeLocation *)(__fn + 8),
                      (pool_ptr<soul::heart::Expression> *)&stack0xffffffffffffffd8,pFVar1);
  pool_ptr<soul::heart::Expression>::~pool_ptr
            ((pool_ptr<soul::heart::Expression> *)&stack0xffffffffffffffd8);
  pool_ptr<soul::heart::Expression>::~pool_ptr(&local_30);
  __begin2 = (pool_ref<soul::heart::Expression> *)&fc->arguments;
  local_20 = pMVar2;
  __end2 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::begin
                     ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)
                      __begin2);
  arg = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::end
                  ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)__begin2)
  ;
  for (; __end2 != arg; __end2 = __end2 + 1) {
    local_60 = __end2;
    this_00 = (ArgListType *)&local_20->fullName;
    pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)__end2);
    pEVar3 = cloneExpression(this,pEVar3);
    pool_ref<soul::heart::Expression>::pool_ref<soul::heart::Expression,void>(&local_68,pEVar3);
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
              (this_00,&local_68);
    pool_ref<soul::heart::Expression>::~pool_ref(&local_68);
  }
  return (int)local_20;
}

Assistant:

heart::FunctionCall& clone (const heart::FunctionCall& old)
    {
        auto& fc = newModule.allocate<heart::FunctionCall> (old.location,
                                                            cloneExpressionPtr (old.target),
                                                            getRemappedFunction (old.getFunction()));

        for (auto& arg : old.arguments)
            fc.arguments.push_back (cloneExpression (arg));

        return fc;
    }